

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldConvertors.h
# Opt level: O1

UtcTimeStamp *
FIX::UtcTimeStampConvertor::convert(UtcTimeStamp *__return_storage_ptr__,string *value)

{
  ulong uVar1;
  char *pcVar2;
  FieldConvertError *this;
  int day;
  int month;
  long lVar3;
  int year;
  int hour;
  int minute;
  int second;
  int fraction;
  ulong uVar4;
  
  uVar1 = value->_M_string_length;
  if (uVar1 - 0x1c < 0xfffffffffffffff5) {
    this = (FieldConvertError *)__cxa_allocate_exception(0x50);
    FieldConvertError::FieldConvertError(this,value);
  }
  else {
    lVar3 = 0;
    do {
      if (9 < (int)(value->_M_dataplus)._M_p[lVar3] - 0x30U) {
        this = (FieldConvertError *)__cxa_allocate_exception(0x50);
        FieldConvertError::FieldConvertError(this,value);
        goto LAB_0015f4c2;
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 != 8);
    pcVar2 = (value->_M_dataplus)._M_p;
    if (pcVar2[8] == '-') {
      lVar3 = 9;
      do {
        if (9 < (int)pcVar2[lVar3] - 0x30U) {
          this = (FieldConvertError *)__cxa_allocate_exception(0x50);
          FieldConvertError::FieldConvertError(this,value);
          goto LAB_0015f4c2;
        }
        lVar3 = lVar3 + 1;
      } while ((int)lVar3 == 10);
      if (pcVar2[0xb] == ':') {
        lVar3 = 0xc;
        do {
          if (9 < (int)pcVar2[lVar3] - 0x30U) {
            this = (FieldConvertError *)__cxa_allocate_exception(0x50);
            FieldConvertError::FieldConvertError(this,value);
            goto LAB_0015f4c2;
          }
          lVar3 = lVar3 + 1;
        } while ((int)lVar3 == 0xd);
        if (pcVar2[0xe] == ':') {
          lVar3 = 0xf;
          do {
            if (9 < (int)pcVar2[lVar3] - 0x30U) {
              this = (FieldConvertError *)__cxa_allocate_exception(0x50);
              FieldConvertError::FieldConvertError(this,value);
              goto LAB_0015f4c2;
            }
            lVar3 = lVar3 + 1;
          } while ((int)lVar3 == 0x10);
          if (((int)pcVar2[5] + pcVar2[4] * 10) - 0x21dU < 0xfffffff4) {
            this = (FieldConvertError *)__cxa_allocate_exception(0x50);
            FieldConvertError::FieldConvertError(this,value);
          }
          else if (((int)pcVar2[7] + pcVar2[6] * 10) - 0x230U < 0xffffffe1) {
            this = (FieldConvertError *)__cxa_allocate_exception(0x50);
            FieldConvertError::FieldConvertError(this,value);
          }
          else if ((int)pcVar2[10] + pcVar2[9] * 10 + -0x1e0 < 0x48) {
            if ((int)pcVar2[0xd] + pcVar2[0xc] * 10 + -0x1e0 < 0x6c) {
              if (pcVar2[0x10] + -0x1e0 + pcVar2[0xf] * 10 < 0x6d) {
                year = pcVar2[3] + -0xd050 +
                       ((int)pcVar2[2] + ((int)pcVar2[1] + *pcVar2 * 10) * 10) * 10;
                month = pcVar2[5] + -0x210 + pcVar2[4] * 10;
                day = pcVar2[7] + -0x210 + pcVar2[6] * 10;
                hour = (int)pcVar2[10] + pcVar2[9] * 10 + -0x210;
                minute = (int)pcVar2[0xd] + pcVar2[0xc] * 10 + -0x210;
                second = pcVar2[0x10] + -0x210 + pcVar2[0xf] * 10;
                if (uVar1 == 0x11) {
                  DateTime::DateTime(&__return_storage_ptr__->super_DateTime,year,month,day,hour,
                                     minute,second,0);
                }
                else {
                  if (pcVar2[0x11] != '.') {
                    this = (FieldConvertError *)__cxa_allocate_exception(0x50);
                    FieldConvertError::FieldConvertError(this,value);
                    goto LAB_0015f4c2;
                  }
                  fraction = 0;
                  if (0x12 < uVar1) {
                    uVar4 = 0x12;
                    fraction = 0;
                    do {
                      if (9 < (int)pcVar2[uVar4] - 0x30U) {
                        this = (FieldConvertError *)__cxa_allocate_exception(0x50);
                        FieldConvertError::FieldConvertError(this,value);
                        goto LAB_0015f4c2;
                      }
                      fraction = (int)pcVar2[uVar4] + fraction * 10 + -0x30;
                      uVar4 = uVar4 + 1;
                    } while (uVar1 != uVar4);
                  }
                  DateTime::DateTime(&__return_storage_ptr__->super_DateTime,year,month,day,hour,
                                     minute,second,fraction,(int)uVar1 + -0x12);
                }
                (__return_storage_ptr__->super_DateTime)._vptr_DateTime =
                     (_func_int **)&PTR__DateTime_001ed798;
                return __return_storage_ptr__;
              }
              this = (FieldConvertError *)__cxa_allocate_exception(0x50);
              FieldConvertError::FieldConvertError(this,value);
            }
            else {
              this = (FieldConvertError *)__cxa_allocate_exception(0x50);
              FieldConvertError::FieldConvertError(this,value);
            }
          }
          else {
            this = (FieldConvertError *)__cxa_allocate_exception(0x50);
            FieldConvertError::FieldConvertError(this,value);
          }
        }
        else {
          this = (FieldConvertError *)__cxa_allocate_exception(0x50);
          FieldConvertError::FieldConvertError(this,value);
        }
      }
      else {
        this = (FieldConvertError *)__cxa_allocate_exception(0x50);
        FieldConvertError::FieldConvertError(this,value);
      }
    }
    else {
      this = (FieldConvertError *)__cxa_allocate_exception(0x50);
      FieldConvertError::FieldConvertError(this,value);
    }
  }
LAB_0015f4c2:
  __cxa_throw(this,&FieldConvertError::typeinfo,FIX::Exception::~Exception);
}

Assistant:

static UtcTimeStamp convert( const std::string& value )
  EXCEPT ( FieldConvertError )
  {
    size_t len = value.size();
    if (len < 17 || len > 27) throw FieldConvertError(value);

    size_t i = 0;
    int c = 0;
    for( c = 0; c < 8; ++c )
      if( !IS_DIGIT(value[i++]) ) throw FieldConvertError(value);
    if (value[i++] != '-') throw FieldConvertError(value);
    for( c = 0; c < 2; ++c )
      if( !IS_DIGIT(value[i++]) ) throw FieldConvertError(value);
    if( value[i++] != ':' ) throw FieldConvertError(value);
    for( c = 0; c < 2; ++c )
      if( !IS_DIGIT(value[i++]) ) throw FieldConvertError(value);
    if( value[i++] != ':' ) throw FieldConvertError(value);
    for( c = 0; c < 2; ++c )
      if( !IS_DIGIT(value[i++]) ) throw FieldConvertError(value);

    int year, mon, mday, hour, min, sec;

    i = 0;

    year = value[i++] - '0';
    year = 10 * year + value[i++] - '0';
    year = 10 * year + value[i++] - '0';
    year = 10 * year + value[i++] - '0';

    mon = value[i++] - '0';
    mon = 10 * mon + value[i++] - '0';
    if( mon < 1 || 12 < mon ) throw FieldConvertError(value);

    mday = value[i++] - '0';
    mday = 10 * mday + value[i++] - '0';
    if( mday < 1 || 31 < mday ) throw FieldConvertError(value);

    ++i; // skip '-'

    hour = value[i++] - '0';
    hour = 10 * hour + value[i++] - '0';
    // No check for >= 0 as no '-' are converted here
    if( 23 < hour ) throw FieldConvertError(value);

    ++i; // skip ':'

    min = value[i++] - '0';
    min = 10 * min + value[i++] - '0';
    // No check for >= 0 as no '-' are converted here
    if( 59 < min ) throw FieldConvertError(value);

    ++i; // skip ':'

    sec = value[i++] - '0';
    sec = 10 * sec + value[i++] - '0';

    // No check for >= 0 as no '-' are converted here
    if( 60 < sec ) throw FieldConvertError(value);

    if (len == 17)
      return UtcTimeStamp (hour, min, sec, 0,
                           mday, mon, year);

    if( value[i++] != '.' ) throw FieldConvertError(value);

    int fraction = 0;
    for (; i < len; ++i)
    {
      char ch = value[i];
      if( !IS_DIGIT(ch)) throw FieldConvertError(value);
      fraction = (fraction * 10) + ch - '0';
    }

    return UtcTimeStamp (hour, min, sec, fraction,
                         mday, mon, year, len - 17 - 1);
  }